

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

int wally_tx_to_bytes(wally_tx *tx,uint32_t flags,uchar *bytes_out,size_t len,size_t *written)

{
  int iVar1;
  size_t local_40;
  size_t is_elements;
  size_t *written_local;
  size_t len_local;
  uchar *bytes_out_local;
  wally_tx *pwStack_18;
  uint32_t flags_local;
  wally_tx *tx_local;
  
  local_40 = 0;
  is_elements = (size_t)written;
  written_local = (size_t *)len;
  len_local = (size_t)bytes_out;
  bytes_out_local._4_4_ = flags;
  pwStack_18 = tx;
  iVar1 = wally_tx_is_elements(tx,&local_40);
  if (iVar1 == 0) {
    tx_local._4_4_ =
         tx_to_bytes(pwStack_18,(tx_serialize_opts *)0x0,bytes_out_local._4_4_,(uchar *)len_local,
                     (size_t)written_local,(size_t *)is_elements,local_40 != 0);
  }
  else {
    tx_local._4_4_ = -2;
  }
  return tx_local._4_4_;
}

Assistant:

int wally_tx_to_bytes(const struct wally_tx *tx, uint32_t flags,
                      unsigned char *bytes_out, size_t len,
                      size_t *written)
{
    size_t is_elements = 0;

#ifdef BUILD_ELEMENTS
    if (wally_tx_is_elements(tx, &is_elements) != WALLY_OK)
        return WALLY_EINVAL;
#endif
    return tx_to_bytes(tx, NULL, flags, bytes_out, len, written, is_elements);
}